

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O3

void nni_tcp_dial(nni_tcp_dialer *d,nni_sockaddr *sa,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  _Bool _Var2;
  int iVar3;
  nng_err result;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  undefined1 local_b8 [8];
  sockaddr_storage ss;
  nni_tcp_conn *c;
  
  nni_aio_reset(aio);
  sVar5 = nni_posix_nn2sockaddr(local_b8,sa);
  if ((sVar5 == 0) || ((local_b8._0_2_ & 0xfff7) != 2)) {
    result = NNG_EADDRINVAL;
    goto LAB_00135e21;
  }
  iVar3 = socket((uint)(ushort)local_b8._0_2_,0x80001,0);
  if (iVar3 < 0) {
    piVar6 = __errno_location();
    result = nni_plat_errno(*piVar6);
    goto LAB_00135e21;
  }
  result = nni_posix_tcp_alloc((nni_tcp_conn **)&ss.__ss_align,d,iVar3);
  if (result != NNG_OK) {
    close(iVar3);
    goto LAB_00135e21;
  }
  nni_refcnt_hold(&d->ref);
  mtx = &d->mtx;
  nni_mtx_lock(mtx);
  _Var2 = nni_aio_start(aio,tcp_dialer_cancel,d);
  if (!_Var2) {
    nni_mtx_unlock(mtx);
    nng_stream_free((nng_stream *)ss.__ss_align);
    return;
  }
  result = NNG_ECLOSED;
  if (d->closed == false) {
    if ((d->srclen == 0) ||
       (iVar4 = bind(iVar3,(sockaddr *)&d->src,(socklen_t)d->srclen), iVar4 == 0)) {
      *(nni_aio **)(ss.__ss_align + 0xd0) = aio;
      iVar3 = connect(iVar3,(sockaddr *)local_b8,(socklen_t)sVar5);
      if (iVar3 == 0) {
        *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
        nni_aio_set_prov_data(aio,(void *)0x0);
        _Var2 = d->nodelay;
        _Var1 = d->keepalive;
        nni_mtx_unlock(mtx);
        nni_posix_tcp_start((nni_tcp_conn *)ss.__ss_align,(uint)_Var2,(uint)_Var1);
        nni_aio_set_output(aio,0,(void *)ss.__ss_align);
        nni_aio_finish(aio,NNG_OK,0);
        return;
      }
      piVar6 = __errno_location();
      iVar3 = *piVar6;
      if (iVar3 == 0x73) {
        result = nni_posix_pfd_arm((nni_posix_pfd *)(ss.__ss_align + 0x38),4);
        if (result == NNG_OK) {
          nni_aio_set_prov_data(aio,(void *)ss.__ss_align);
          nni_list_append(&d->connq,aio);
          nni_mtx_unlock(mtx);
          return;
        }
        goto LAB_00135f3a;
      }
    }
    else {
      piVar6 = __errno_location();
      iVar3 = *piVar6;
    }
    result = nni_plat_errno(iVar3);
  }
LAB_00135f3a:
  *(undefined8 *)(ss.__ss_align + 0xd0) = 0;
  nni_aio_set_prov_data(aio,(void *)0x0);
  nni_mtx_unlock(mtx);
  nng_stream_close((nng_stream *)ss.__ss_align);
  nng_stream_stop((nng_stream *)ss.__ss_align);
  nng_stream_free((nng_stream *)ss.__ss_align);
LAB_00135e21:
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

void
nni_tcp_dial(nni_tcp_dialer *d, const nni_sockaddr *sa, nni_aio *aio)
{
	nni_tcp_conn           *c;
	struct sockaddr_storage ss;
	size_t                  sslen;
	int                     fd;
	int                     rv;
	int                     ka;
	int                     nd;

	nni_aio_reset(aio);

	if (((sslen = nni_posix_nn2sockaddr(&ss, sa)) == 0) ||
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))) {
		nni_aio_finish_error(aio, NNG_EADDRINVAL);
		return;
	}

	if ((fd = socket(ss.ss_family, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		nni_aio_finish_error(aio, nni_plat_errno(errno));
		return;
	}

	if ((rv = nni_posix_tcp_alloc(&c, d, fd)) != 0) {
		(void) close(fd);
		nni_aio_finish_error(aio, rv);
		return;
	}

	// hold for the stream
	nni_refcnt_hold(&d->ref);

	nni_mtx_lock(&d->mtx);
	if (!nni_aio_start(aio, tcp_dialer_cancel, d)) {
		nni_mtx_unlock(&d->mtx);
		nng_stream_free(&c->stream);
		return;
	}

	if (d->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	if (d->srclen != 0) {
		if (bind(fd, (void *) &d->src, d->srclen) != 0) {
			rv = nni_plat_errno(errno);
			goto error;
		}
	}
	c->dial_aio = aio;
	if (connect(fd, (void *) &ss, sslen) != 0) {
		if (errno != EINPROGRESS) {
			rv = nni_plat_errno(errno);
			goto error;
		}
		// Asynchronous connect.
		if ((rv = nni_posix_pfd_arm(&c->pfd, NNI_POLL_OUT)) != 0) {
			goto error;
		}
		nni_aio_set_prov_data(aio, c);
		nni_list_append(&d->connq, aio);
		nni_mtx_unlock(&d->mtx);
		return;
	}
	// Immediate connect, cool!  This probably only happens
	// on loop back, and probably not on every platform.
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nd = d->nodelay ? 1 : 0;
	ka = d->keepalive ? 1 : 0;
	nni_mtx_unlock(&d->mtx);
	nni_posix_tcp_start(c, nd, ka);
	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
	return;

error:
	c->dial_aio = NULL;
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);
	nng_stream_close(&c->stream);
	nng_stream_stop(&c->stream);
	nng_stream_free(&c->stream);
	nni_aio_finish_error(aio, rv);
}